

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlookup.cpp
# Opt level: O3

int __thiscall
CVmObjLookupTable::for_each_gen
          (CVmObjLookupTable *this,vm_obj_id_t self,vm_val_t *retval,uint *argc,int pass_key_to_cb,
          vm_rcdesc *rc)

{
  anon_union_8_8_cb74652f_for_val aVar1;
  vm_datatype_t *pvVar2;
  uint uVar3;
  vm_val_t *pvVar4;
  vm_val_t *pvVar5;
  int iVar6;
  uint argc_00;
  uint *puVar7;
  uint uVar8;
  
  if (for_each_gen(unsigned_int,vm_val_t*,unsigned_int*,int,vm_rcdesc*)::desc == '\0') {
    for_each_gen();
  }
  iVar6 = CVmObject::get_prop_check_argc(retval,argc,&for_each_gen::desc);
  pvVar5 = sp_;
  if (iVar6 == 0) {
    pvVar2 = &sp_->typ;
    sp_ = sp_ + 1;
    *pvVar2 = VM_OBJ;
    (pvVar5->val).obj = self;
    puVar7 = (uint *)(this->super_CVmObjCollection).super_CVmObject.ext_;
    uVar8 = puVar7[1];
    if (uVar8 != 0) {
      puVar7 = puVar7 + (ulong)*puVar7 * 2 + 8;
      do {
        pvVar4 = sp_;
        if (*puVar7 != 0xd) {
          uVar3 = puVar7[5];
          aVar1 = *(anon_union_8_8_cb74652f_for_val *)(puVar7 + 6);
          sp_ = sp_ + 1;
          pvVar4->typ = puVar7[4];
          *(uint *)&pvVar4->field_0x4 = uVar3;
          pvVar4->val = aVar1;
          pvVar4 = sp_;
          if (pass_key_to_cb == 0) {
            argc_00 = 1;
          }
          else {
            uVar3 = puVar7[1];
            aVar1 = *(anon_union_8_8_cb74652f_for_val *)(puVar7 + 2);
            sp_ = sp_ + 1;
            pvVar4->typ = puVar7[0];
            *(uint *)&pvVar4->field_0x4 = uVar3;
            pvVar4->val = aVar1;
            argc_00 = 2;
          }
          CVmRun::call_func_ptr(&G_interpreter_X,pvVar5 + -1,argc_00,rc,0);
        }
        puVar7 = puVar7 + 10;
        uVar8 = uVar8 - 1;
      } while (uVar8 != 0);
    }
    sp_ = sp_ + -2;
    retval->typ = VM_NIL;
  }
  return 1;
}

Assistant:

int CVmObjLookupTable::for_each_gen(VMG_ vm_obj_id_t self,
                                    vm_val_t *retval, uint *argc,
                                    int pass_key_to_cb, vm_rcdesc *rc)
{
    vm_val_t *fn;
    vm_lookup_val *entry;
    static CVmNativeCodeDesc desc(1);
    uint i;

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* the function to invoke is the top argument */
    fn = G_stk->get(0);

    /* push a self-reference for gc protection */
    G_stk->push()->set_obj(self);

    /* iterate over each bucket */
    for (i = get_entry_count(), entry = get_ext()->idx_to_val(0) ;
         i != 0 ; --i, ++entry)
    {
        /* 
         *   if it's in use (i.e., if the key is non-empty), invoke the
         *   callback for the entry 
         */
        if (entry->key.typ != VM_EMPTY)
        {
            /* push the current value argument */
            G_stk->push(&entry->val);

            /* push the key if desired */
            if (pass_key_to_cb)
                G_stk->push(&entry->key);
            
            /* invoke the callback */
            G_interpreter->call_func_ptr(vmg_ fn, pass_key_to_cb ? 2 : 1,
                                         rc, 0);
        }
    }

    /* discard the arguments and gc protection */
    G_stk->discard(2);

    /* no return value */
    retval->set_nil();

    /* handled */
    return TRUE;
}